

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShellIntrinsics.cpp
# Opt level: O2

IntrinsicResult intrinsic_import(Context *context,IntrinsicResult *partialResult)

{
  long *plVar1;
  byte bVar2;
  Context *this;
  bool bVar3;
  String *pSVar4;
  long lVar5;
  long lVar6;
  FILE *__stream;
  FunctionStorage *func;
  long lVar7;
  unsigned_long idx;
  char *__filename;
  unsigned_long uVar8;
  long lVar9;
  long lVar10;
  String libname_1;
  Value local_248;
  undefined1 local_238 [32];
  String local_218;
  String path;
  String local_1f8;
  undefined1 local_1e8 [32];
  String moduleSource;
  String libname;
  StringList libDirs;
  anon_union_8_3_2f476f46_for_data local_190;
  StringStorage *local_188;
  anon_union_8_3_2f476f46_for_data local_180 [2];
  anon_union_8_3_2f476f46_for_data local_170;
  ListStorage<MiniScript::Context_*> *local_168;
  Parser parser;
  Value searchPath;
  String local_a0;
  String local_90;
  String local_80;
  String local_70;
  Value local_60;
  String local_50;
  String local_40;
  
  MiniScript::IntrinsicResult::Result((IntrinsicResult *)&parser);
  bVar2 = (byte)parser.errorContext.ss;
  MiniScript::Value::~Value((Value *)&parser);
  if (bVar2 != 0) {
    MiniScript::Context::GetTemp((Context *)&parser,(int)partialResult);
    MiniScript::IntrinsicResult::Result((IntrinsicResult *)local_238);
    MiniScript::Value::ToString((Value *)&libname_1,(Machine *)local_238);
    MiniScript::Value::~Value((Value *)local_238);
    this = (Context *)partialResult[0xb].rs;
    MiniScript::String::String(&local_70,&libname_1);
    local_170.tempNum._0_1_ = (byte)parser.errorContext.ss;
    local_170.tempNum._1_2_ = parser.errorContext.ss._1_2_;
    local_168 = (ListStorage<MiniScript::Context_*> *)parser.errorContext._8_8_;
    if (parser.errorContext._8_8_ != 0 && 2 < (byte)parser.errorContext.ss) {
      *(long *)(parser.errorContext._8_8_ + 8) = *(long *)(parser.errorContext._8_8_ + 8) + 1;
    }
    MiniScript::Context::SetVar(this,&local_70,(Value *)&local_170);
    MiniScript::Value::~Value((Value *)&local_170);
    MiniScript::String::release(&local_70);
    MiniScript::IntrinsicResult::IntrinsicResult
              ((IntrinsicResult *)context,(IntrinsicResult *)&MiniScript::IntrinsicResult::Null);
    MiniScript::String::release(&libname_1);
    MiniScript::Value::~Value((Value *)&parser);
    return (IntrinsicResult)(IntrinsicResultStorage *)context;
  }
  MiniScript::String::String(&local_50,"libname");
  MiniScript::Context::GetVar((Context *)&parser,(String *)partialResult,(LocalOnlyMode)&local_50);
  MiniScript::Value::ToString((Value *)&libname,(Machine *)&parser);
  MiniScript::Value::~Value((Value *)&parser);
  MiniScript::String::release(&local_50);
  if ((libname.ss == (StringStorage *)0x0) || ((libname.ss)->dataSize < 2)) {
    MiniScript::String::String(&local_80,"import: libname required");
    pSVar4 = &local_80;
    MiniScript::RuntimeException::RuntimeException((RuntimeException *)&parser,pSVar4);
    MiniScript::RuntimeException::raise((RuntimeException *)&parser,(int)pSVar4);
    MiniScript::MiniscriptException::~MiniscriptException((MiniscriptException *)&parser);
    MiniScript::String::release(&local_80);
  }
  getEnvMap();
  MiniScript::Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue>::Lookup
            ((Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue> *)&searchPath
             ,(Value *)&parser,&_MS_IMPORT_PATH);
  MiniScript::Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue>::~Dictionary
            ((Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue> *)&parser);
  libDirs.ls = (ListStorage<MiniScript::String> *)0x0;
  libDirs.isTemp = false;
  if (searchPath.type != Null) {
    MiniScript::Value::ToString((Value *)&libname_1,(Machine *)&searchPath);
    MiniScript::String::String((String *)local_238,":");
    MiniScript::Split((MiniScript *)&parser,&libname_1,(String *)local_238,-1);
    MiniScript::List<MiniScript::String>::operator=(&libDirs,(List<MiniScript::String> *)&parser);
    MiniScript::List<MiniScript::String>::release((List<MiniScript::String> *)&parser);
    MiniScript::String::release((String *)local_238);
    MiniScript::String::release(&libname_1);
    if (libDirs.ls != (ListStorage<MiniScript::String> *)0x0) {
      uVar8 = ((libDirs.ls)->super_SimpleVector<MiniScript::String>).mQtyItems;
      goto LAB_00110398;
    }
  }
  uVar8 = 0;
LAB_00110398:
  moduleSource.isTemp = false;
  moduleSource.ss = (StringStorage *)0x0;
  idx = 0;
  if ((long)uVar8 < 1) {
    uVar8 = idx;
  }
  bVar3 = false;
LAB_001103bd:
  if (idx != uVar8) {
    pSVar4 = MiniScript::List<MiniScript::String>::operator[](&libDirs,idx);
    MiniScript::String::String(&path,pSVar4);
    if ((path.ss == (StringStorage *)0x0) || ((path.ss)->dataSize < 2)) {
      MiniScript::String::operator=(&path,".");
    }
    else if ((path.ss)->data[(path.ss)->dataSize - 2] != '/') {
      MiniScript::String::String(&parser.errorContext,'/');
      MiniScript::String::Append(&path,&parser.errorContext);
      MiniScript::String::release(&parser.errorContext);
    }
    MiniScript::String::operator+(&parser.errorContext,(char *)&libname);
    MiniScript::String::Append(&path,&parser.errorContext);
    MiniScript::String::release(&parser.errorContext);
    MiniScript::String::String((String *)local_180,&path);
    if (local_180[0].ref == (RefCountedStorage *)0x0) {
      lVar7 = 0;
    }
    else {
      lVar7 = local_180[0].ref[1].refCount + -1;
    }
    getEnvMap();
    do {
      lVar5 = MiniScript::String::IndexOfB((String *)local_180,"${",0);
      if (lVar5 < 0) {
LAB_0011059d:
        lVar5 = MiniScript::String::IndexOfB((String *)local_180,"$(",0);
        if (lVar5 < 0) {
LAB_001106bf:
          lVar5 = MiniScript::String::IndexOfB((String *)local_180,"$",0);
          if (lVar5 < 0) goto LAB_00110857;
          lVar5 = lVar5 + 1;
          lVar6 = lVar5;
          lVar9 = lVar5;
          if (lVar5 < lVar7) {
            lVar9 = lVar7;
          }
          while ((((lVar10 = lVar9, lVar6 < lVar7 &&
                   (bVar2 = *(byte *)((long)local_180[0].ref[1]._vptr_RefCountedStorage + lVar6),
                   lVar10 = lVar6, '/' < (char)bVar2)) && (6 < (byte)(bVar2 - 0x3a))) &&
                 ((0x24 < bVar2 - 0x5b ||
                  ((0x1f0000002fU >> ((ulong)(bVar2 - 0x5b) & 0x3f) & 1) == 0))))) {
            lVar6 = lVar6 + 1;
          }
          MiniScript::String::SubstringB(&libname_1,(long)local_180,lVar5);
          MiniScript::String::Substring((String *)(local_238 + 0x10),(long)local_180,0);
          local_248.type = String;
          local_248.noInvoke = false;
          local_248.localOnly = Off;
          local_248.data = (anon_union_8_3_2f476f46_for_data)libname_1.ss;
          if (libname_1.ss == (StringStorage *)0x0) {
            local_248.data = (anon_union_8_3_2f476f46_for_data)MiniScript::Value::emptyString._8_8_;
          }
          if ((StringStorage *)local_248.data.ref != (StringStorage *)0x0) {
            (local_248.data.ref)->refCount = (local_248.data.ref)->refCount + 1;
          }
          MiniScript::Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue>::
          Lookup((Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue> *)
                 local_1e8,(Value *)&parser,&local_248);
          MiniScript::Value::ToString((Value *)(local_1e8 + 0x10),(Machine *)local_1e8);
          MiniScript::String::operator+(&local_218,(String *)(local_238 + 0x10));
          MiniScript::String::SubstringB(&local_1f8,(long)local_180,lVar10);
          MiniScript::String::operator+((String *)local_238,&local_218);
          MiniScript::String::operator=((String *)local_180,(String *)local_238);
        }
        else {
          lVar6 = 1;
          do {
            if (lVar7 <= lVar6 + lVar5) goto LAB_001106bf;
            lVar9 = lVar6 + 1;
            lVar10 = lVar6 + lVar5;
            lVar6 = lVar9;
          } while (*(char *)((long)local_180[0].ref[1]._vptr_RefCountedStorage + lVar10) != ')');
          MiniScript::String::SubstringB(&libname_1,(long)local_180,lVar5 + 2);
          MiniScript::String::Substring((String *)(local_238 + 0x10),(long)local_180,0);
          local_248.type = String;
          local_248.noInvoke = false;
          local_248.localOnly = Off;
          local_248.data = (anon_union_8_3_2f476f46_for_data)libname_1.ss;
          if (libname_1.ss == (StringStorage *)0x0) {
            local_248.data = (anon_union_8_3_2f476f46_for_data)MiniScript::Value::emptyString._8_8_;
          }
          if ((StringStorage *)local_248.data.ref != (StringStorage *)0x0) {
            (local_248.data.ref)->refCount = (local_248.data.ref)->refCount + 1;
          }
          MiniScript::Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue>::
          Lookup((Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue> *)
                 local_1e8,(Value *)&parser,&local_248);
          MiniScript::Value::ToString((Value *)(local_1e8 + 0x10),(Machine *)local_1e8);
          MiniScript::String::operator+(&local_218,(String *)(local_238 + 0x10));
          MiniScript::String::SubstringB(&local_1f8,(long)local_180,lVar5 + lVar9);
          MiniScript::String::operator+((String *)local_238,&local_218);
          MiniScript::String::operator=((String *)local_180,(String *)local_238);
        }
      }
      else {
        lVar6 = 1;
        do {
          if (lVar7 <= lVar6 + lVar5) goto LAB_0011059d;
          lVar9 = lVar6 + 1;
          lVar10 = lVar6 + lVar5;
          lVar6 = lVar9;
        } while (*(char *)((long)local_180[0].ref[1]._vptr_RefCountedStorage + lVar10) != '}');
        MiniScript::String::SubstringB(&libname_1,(long)local_180,lVar5 + 2);
        MiniScript::String::Substring((String *)(local_238 + 0x10),(long)local_180,0);
        local_248.type = String;
        local_248.noInvoke = false;
        local_248.localOnly = Off;
        local_248.data = (anon_union_8_3_2f476f46_for_data)libname_1.ss;
        if (libname_1.ss == (StringStorage *)0x0) {
          local_248.data = (anon_union_8_3_2f476f46_for_data)MiniScript::Value::emptyString._8_8_;
        }
        if ((StringStorage *)local_248.data.ref != (StringStorage *)0x0) {
          (local_248.data.ref)->refCount = (local_248.data.ref)->refCount + 1;
        }
        MiniScript::Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue>::Lookup
                  ((Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue> *)
                   local_1e8,(Value *)&parser,&local_248);
        MiniScript::Value::ToString((Value *)(local_1e8 + 0x10),(Machine *)local_1e8);
        MiniScript::String::operator+(&local_218,(String *)(local_238 + 0x10));
        MiniScript::String::SubstringB(&local_1f8,(long)local_180,lVar5 + lVar9);
        MiniScript::String::operator+((String *)local_238,&local_218);
        MiniScript::String::operator=((String *)local_180,(String *)local_238);
      }
      MiniScript::String::release((String *)local_238);
      MiniScript::String::release(&local_1f8);
      MiniScript::String::release(&local_218);
      MiniScript::String::release((String *)(local_1e8 + 0x10));
      MiniScript::Value::~Value((Value *)local_1e8);
      MiniScript::Value::~Value(&local_248);
      MiniScript::String::release((String *)(local_238 + 0x10));
      MiniScript::String::release(&libname_1);
    } while( true );
  }
  goto LAB_00110961;
LAB_00110857:
  MiniScript::String::String(&local_40,(String *)local_180);
  MiniScript::Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue>::~Dictionary
            ((Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue> *)&parser);
  MiniScript::String::operator=(&path,&local_40);
  MiniScript::String::release(&local_40);
  MiniScript::String::release((String *)local_180);
  __filename = "";
  if (path.ss != (StringStorage *)0x0) {
    __filename = (path.ss)->data;
  }
  __stream = fopen(__filename,"r");
  if (__stream != (FILE *)0x0) {
    ReadFileHelper((FILE *)&parser,(long)__stream);
    MiniScript::String::operator=(&moduleSource,(String *)&parser);
    MiniScript::String::release((String *)&parser);
    fclose(__stream);
    bVar3 = true;
  }
  MiniScript::String::release(&path);
  idx = idx + 1;
  if (__stream != (FILE *)0x0) {
LAB_00110961:
    if (!bVar3) {
      MiniScript::operator+((MiniScript *)&local_90,"import: library not found: ",&libname);
      pSVar4 = &local_90;
      MiniScript::RuntimeException::RuntimeException((RuntimeException *)&parser,pSVar4);
      MiniScript::RuntimeException::raise((RuntimeException *)&parser,(int)pSVar4);
      MiniScript::MiniscriptException::~MiniscriptException((MiniscriptException *)&parser);
      MiniScript::String::release(&local_90);
    }
    MiniScript::Parser::Parser(&parser);
    MiniScript::String::operator+(&libname_1,(char *)&libname);
    MiniScript::String::operator=(&parser.errorContext,&libname_1);
    MiniScript::String::release(&libname_1);
    MiniScript::String::String(&local_a0,&moduleSource);
    MiniScript::Parser::Parse(&parser,&local_a0,false);
    MiniScript::String::release(&local_a0);
    func = MiniScript::Parser::CreateImport(&parser);
    local_60.type = Temp;
    local_60.noInvoke = false;
    local_60.localOnly = Off;
    local_60.data.tempNum = 0;
    MiniScript::Machine::ManuallyPushCall((Machine *)partialResult[0xe].rs,func,&local_60);
    MiniScript::Value::~Value(&local_60);
    local_190.tempNum._0_2_ = 3;
    local_190.tempNum._2_1_ = 0;
    if (libname.ss == (StringStorage *)0x0) {
      libname.ss = (StringStorage *)MiniScript::Value::emptyString._8_8_;
    }
    if (libname.ss != (StringStorage *)0x0) {
      plVar1 = &((libname.ss)->super_RefCountedStorage).refCount;
      *plVar1 = *plVar1 + 1;
    }
    local_188 = libname.ss;
    MiniScript::IntrinsicResult::IntrinsicResult
              ((IntrinsicResult *)context,(Value *)&local_190,false);
    MiniScript::Value::~Value((Value *)&local_190);
    MiniScript::Parser::~Parser(&parser);
    MiniScript::String::release(&moduleSource);
    MiniScript::List<MiniScript::String>::release(&libDirs);
    MiniScript::Value::~Value(&searchPath);
    MiniScript::String::release(&libname);
    return (IntrinsicResult)(IntrinsicResultStorage *)context;
  }
  goto LAB_001103bd;
}

Assistant:

static IntrinsicResult intrinsic_import(Context *context, IntrinsicResult partialResult) {
	if (!partialResult.Result().IsNull()) {
		// When we're invoked with a partial result, it means that the import
		// function has finished, and stored its result (the values that were
		// created by the import code) in Temp 0.
		Value importedValues = context->GetTemp(0);
		// Now we're going to do something slightly evil.  We're going to reach
		// up into the *parent* context, and store these imported values under
		// the import library name.  Thus, there will always be a standard name
		// by which you can refer to the imported stuff.
		String libname = partialResult.Result().ToString();
		Context *callerContext = context->parent;
		callerContext->SetVar(libname, importedValues);
		return IntrinsicResult::Null;
	}
	// When we're invoked without a partial result, it's time to start the import.
	// Begin by finding the actual code.
	String libname = context->GetVar("libname").ToString();
	if (libname.empty()) {
		RuntimeException("import: libname required").raise();
	}
	
	// Figure out what directories to look for the import modules in.
	Value searchPath = getEnvMap().Lookup(_MS_IMPORT_PATH, Value::null);
	StringList libDirs;
	if (!searchPath.IsNull()) libDirs = Split(searchPath.ToString(), ":");
	
	// Search the lib dirs for a matching file.
	String moduleSource;
	bool found = false;
	for (long i=0, len=libDirs.Count(); i<len; i++) {
		String path = libDirs[i];
		if (path.empty()) path = ".";
		else if (path[path.LengthB() - 1] != PATHSEP) path += String(PATHSEP);
		path += libname + ".ms";
		path = ExpandVariables(path);
		FILE *handle = fopen(path.c_str(), "r");
		if (handle == nullptr) continue;
		moduleSource = ReadFileHelper(handle, -1);
		fclose(handle);
		found = true;
		break;
	}
	if (!found) {
		RuntimeException("import: library not found: " + libname).raise();
	}
	
	// Now, parse that code, and build a function around it that returns
	// its own locals as its result.  Push a manual call.
	Parser parser;
	parser.errorContext = libname + ".ms";
	parser.Parse(moduleSource);
	FunctionStorage *import = parser.CreateImport();
	context->vm->ManuallyPushCall(import, Value::Temp(0));
	
	// That call will not be able to run until we return from this intrinsic.
	// So, return a partial result, with the lib name.  We'll get invoked
	// again after the import function has finished running.
	return IntrinsicResult(libname, false);
}